

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnMemoryCopy
          (SharedValidator *this,Location *loc,Var *destmemidx,Var *srcmemidx)

{
  Result rhs;
  Var local_108;
  Enum local_bc;
  Var local_b8;
  Enum local_6c;
  undefined1 local_68 [8];
  MemoryType dstmt;
  MemoryType srcmt;
  Var *srcmemidx_local;
  Var *destmemidx_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  Opcode::Opcode((Opcode *)&srcmt.limits.field_0x14,MemoryCopy);
  this_local._4_4_ = CheckInstr(this,(Opcode)srcmt.limits._20_4_,loc);
  MemoryType::MemoryType((MemoryType *)&dstmt.limits.has_max);
  MemoryType::MemoryType((MemoryType *)local_68);
  Var::Var(&local_b8,destmemidx);
  local_6c = (Enum)CheckMemoryIndex(this,&local_b8,(MemoryType *)local_68);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_6c);
  Var::~Var(&local_b8);
  Var::Var(&local_108,srcmemidx);
  local_bc = (Enum)CheckMemoryIndex(this,&local_108,(MemoryType *)&dstmt.limits.has_max);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_bc);
  Var::~Var(&local_108);
  rhs = TypeChecker::OnMemoryCopy
                  (&this->typechecker_,(Limits *)local_68,(Limits *)&dstmt.limits.has_max);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnMemoryCopy(const Location& loc,
                                     Var destmemidx,
                                     Var srcmemidx) {
  Result result = CheckInstr(Opcode::MemoryCopy, loc);
  MemoryType srcmt;
  MemoryType dstmt;
  result |= CheckMemoryIndex(destmemidx, &dstmt);
  result |= CheckMemoryIndex(srcmemidx, &srcmt);
  result |= typechecker_.OnMemoryCopy(dstmt.limits, srcmt.limits);
  return result;
}